

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall
Command::Command(Command *this,string *command,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *parameters)

{
  pointer pcVar1;
  
  this->_vptr_Command = (_func_int **)&PTR__SetCommand_0010ace0;
  (this->_command)._M_dataplus._M_p = (pointer)&(this->_command).field_2;
  pcVar1 = (command->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_command,pcVar1,pcVar1 + command->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_parameters,parameters);
  return;
}

Assistant:

Command::Command(const std::string& command, const std::vector<std::string>& parameters)
    : _command(command), _parameters(parameters)
{ }